

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x509.c
# Opt level: O1

int x509_check_time(mbedtls_x509_time *before,mbedtls_x509_time *after)

{
  int iVar1;
  int iVar2;
  int iVar3;
  
  iVar1 = before->year;
  iVar2 = after->year;
  iVar3 = 1;
  if ((iVar1 <= iVar2) &&
     ((iVar1 != iVar2 ||
      ((before->mon <= after->mon &&
       ((iVar1 != iVar2 ||
        (((before->mon != after->mon || (before->day <= after->day)) &&
         ((iVar1 != iVar2 ||
          ((((before->mon != after->mon || (before->day != after->day)) ||
            (before->hour <= after->hour)) &&
           ((iVar1 != iVar2 ||
            ((((before->mon != after->mon || (before->day != after->day)) ||
              ((before->hour != after->hour || (before->min <= after->min)))) &&
             (((iVar1 != iVar2 || (before->mon != after->mon)) ||
              ((before->day != after->day ||
               (((before->hour != after->hour || (before->min != after->min)) ||
                (before->sec <= after->sec)))))))))))))))))))))))) {
    iVar3 = 0;
  }
  return iVar3;
}

Assistant:

static int x509_check_time( const mbedtls_x509_time *before, const mbedtls_x509_time *after )
{
    if( before->year  > after->year )
        return( 1 );

    if( before->year == after->year &&
        before->mon   > after->mon )
        return( 1 );

    if( before->year == after->year &&
        before->mon  == after->mon  &&
        before->day   > after->day )
        return( 1 );

    if( before->year == after->year &&
        before->mon  == after->mon  &&
        before->day  == after->day  &&
        before->hour  > after->hour )
        return( 1 );

    if( before->year == after->year &&
        before->mon  == after->mon  &&
        before->day  == after->day  &&
        before->hour == after->hour &&
        before->min   > after->min  )
        return( 1 );

    if( before->year == after->year &&
        before->mon  == after->mon  &&
        before->day  == after->day  &&
        before->hour == after->hour &&
        before->min  == after->min  &&
        before->sec   > after->sec  )
        return( 1 );

    return( 0 );
}